

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O2

void intgemm::anon_unknown_0::TestMultiplyShiftInt<intgemm::SSSE3::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  float fVar1;
  ostream *poVar2;
  float *pfVar3;
  uchar *puVar4;
  Index size;
  char *pcVar5;
  size_t sVar6;
  IntermediateType sum_1;
  float *pfVar7;
  long lVar8;
  Index k_1;
  Index cols;
  undefined8 in_R8;
  ulong uVar9;
  char *pcVar10;
  IntermediateType sum;
  int iVar11;
  float *pfVar12;
  Index k;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong size_00;
  ulong size_01;
  result_type_conflict rVar16;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<float> bias;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<signed_char> B_quant;
  AlignedVector<signed_char> B_prep;
  AlignedVector<unsigned_char> A_prep;
  param_type local_15c8;
  AlignedVector<float> ShiftedBias;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> A_prep_old;
  undefined4 uStack_157c;
  undefined4 uStack_1564;
  string local_1550;
  ostringstream info;
  mt19937 gen;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&info);
  poVar2 = std::operator<<((ostream *)&info,"8-bit SSSE3");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\t');
  size_00 = (ulong)width;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\t');
  size_01 = (ulong)B_cols;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  AlignedVector<float>::AlignedVector(&A,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&B,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&bias,size_01,0x40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  pfVar3 = A.mem_;
  local_15c8._M_a = -1.0;
  local_15c8._M_b = 1.0;
  lVar13 = A.size_ << 2;
  for (lVar8 = 0; pfVar12 = B.mem_, lVar13 != lVar8; lVar8 = lVar8 + 4) {
    rVar16 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15c8,&gen);
    *(result_type_conflict *)((long)pfVar3 + lVar8) = rVar16;
  }
  lVar8 = CONCAT44(B.size_._4_4_,(uint)B.size_);
  for (lVar13 = 0; cols = (Index)in_R8, lVar8 << 2 != lVar13; lVar13 = lVar13 + 4) {
    rVar16 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15c8,&gen);
    *(result_type_conflict *)((long)pfVar12 + lVar13) = rVar16;
  }
  for (lVar8 = 0; bias.size_ << 2 != lVar8; lVar8 = lVar8 + 4) {
    *(undefined4 *)((long)bias.mem_ + lVar8) = 0;
  }
  AlignedVector<unsigned_char>::AlignedVector(&A_prep,A.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&A_prep_old,A.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&B_prep,CONCAT44(B.size_._4_4_,(uint)B.size_),0x40);
  SSSE3::Kernels8::PrepareA(A.mem_,A_prep.mem_,63.5,A_rows,width);
  SSSE3::Kernels8::PrepareA(A.mem_,A_prep_old.mem_,63.5,A_rows,width);
  size = B_cols;
  SSSE3::Kernels8::PrepareB
            ((Kernels8 *)B.mem_,(float *)B_prep.mem_,(int8_t *)(ulong)width,63.5,B_cols,cols);
  AlignedVector<float>::AlignedVector(&test_C,(ulong)(B_cols * A_rows),0x40);
  AlignedVector<signed_char>::AlignedVector(&B_quant,CONCAT44(B.size_._4_4_,(uint)B.size_),0x40);
  SSSE3::Kernels8::Quantize
            ((Kernels8 *)B.mem_,(float *)B_quant.mem_,(int8_t *)(ulong)(uint)B.size_,63.5,size);
  AlignedVector<float>::AlignedVector(&slowint_C,test_C.size_,0x40);
  AlignedVector<float>::AlignedVector(&float_C,test_C.size_,0x40);
  pfVar3 = A.mem_;
  for (uVar9 = 0; uVar9 != A_rows; uVar9 = uVar9 + 1) {
    pfVar12 = B.mem_;
    for (uVar15 = 0; uVar15 != size_01; uVar15 = uVar15 + 1) {
      fVar1 = 0.0;
      pfVar7 = pfVar12;
      for (uVar14 = 0; size_00 != uVar14; uVar14 = uVar14 + 1) {
        fVar1 = fVar1 + *pfVar7 * pfVar3[uVar14];
        pfVar7 = pfVar7 + size_01;
      }
      float_C.mem_[uVar9 * size_01 + uVar15] = fVar1 + bias.mem_[uVar15];
      pfVar12 = pfVar12 + 1;
    }
    pfVar3 = pfVar3 + size_00;
  }
  AlignedVector<signed_char>::AlignedVector(&A_prep2,size_00,0x40);
  for (sVar6 = 0; A_prep2.size_ != sVar6; sVar6 = sVar6 + 1) {
    A_prep2.mem_[sVar6] = '\x01';
  }
  AlignedVector<float>::AlignedVector(&ShiftedBias,size_01,0x40);
  pcVar5 = B_quant.mem_;
  for (uVar9 = 0; uVar9 != size_01; uVar9 = uVar9 + 1) {
    iVar11 = 0;
    pcVar10 = pcVar5;
    for (uVar15 = 0; size_00 != uVar15; uVar15 = uVar15 + 1) {
      iVar11 = iVar11 + (int)*pcVar10 * (int)A_prep2.mem_[uVar15];
      pcVar10 = pcVar10 + size_01;
    }
    ShiftedBias.mem_[uVar9] = (float)iVar11 * -0.031496063 + bias.mem_[uVar9];
    pcVar5 = pcVar5 + 1;
  }
  callback._4_4_ = uStack_1564;
  callback.unquant_mult = -0.031496063;
  callback.bias_addr = bias.mem_;
  callback.output_addr = bias.mem_;
  SSSE3::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (B_prep.mem_,width,B_cols,callback);
  callback_00._4_4_ = uStack_157c;
  callback_00.unquant_mult = 0.0002480005;
  callback_00.bias_addr = bias.mem_;
  callback_00.output_addr = test_C.mem_;
  SSSE3::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (A_prep.mem_,B_prep.mem_,A_rows,width,B_cols,callback_00);
  pfVar7 = slowint_C.mem_;
  pfVar12 = float_C.mem_;
  pfVar3 = test_C.mem_;
  puVar4 = A_prep.mem_;
  for (uVar9 = 0; uVar9 != A_rows; uVar9 = uVar9 + 1) {
    pcVar5 = B_quant.mem_;
    for (uVar15 = 0; uVar15 != size_01; uVar15 = uVar15 + 1) {
      iVar11 = 0;
      pcVar10 = pcVar5;
      for (uVar14 = 0; size_00 != uVar14; uVar14 = uVar14 + 1) {
        iVar11 = iVar11 + (int)*pcVar10 * (uint)puVar4[uVar14];
        pcVar10 = pcVar10 + size_01;
      }
      slowint_C.mem_[uVar9 * size_01 + uVar15] =
           (float)iVar11 * 0.0002480005 + ShiftedBias.mem_[uVar15];
      pcVar5 = pcVar5 + 1;
    }
    puVar4 = puVar4 + size_00;
  }
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar12,pfVar7,pfVar3,test_C.size_,&local_1550,0.0001,int_tolerance,float_tolerance,
             0.0001);
  std::__cxx11::string::~string((string *)&local_1550);
  free(ShiftedBias.mem_);
  free(A_prep2.mem_);
  free(float_C.mem_);
  free(slowint_C.mem_);
  free(B_quant.mem_);
  free(test_C.mem_);
  free(B_prep.mem_);
  free(A_prep_old.mem_);
  free(A_prep.mem_);
  free(bias.mem_);
  free(B.mem_);
  free(A.mem_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&info);
  return;
}

Assistant:

void TestMultiplyShiftInt(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = 0;
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> A_prep_old(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareA(A.begin(), A_prep_old.begin(), quant_mult, A_rows, width); //Non shited version
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*
   * Reference float multiplication
   */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  // references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
  //   return sum * unquant_mult + bias[info.col_idx];
  // });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });
  /*
   * Multiply8 shift multiplication
   */
  //First prepare SlowInteger Bias:
  AlignedVector<int8_t> A_prep2(1*width);
  for (auto& it : A_prep2) {
    it = 1;
  }
  AlignedVector<float> ShiftedBias(B_cols);
  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  references::Multiply(A_prep2.begin(), B_quant.begin(), ShiftedBias.begin(), 1, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult_forprep + bias[info.col_idx];
  });
  

  //Now prepare Fast integer Bias
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  // Reference INT VERSION HERE with ADD127
  // Taking the original A_preparation which means A would be int8_t
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + ShiftedBias[info.col_idx];
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}